

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O3

void __thiscall
muduo::Logger::Impl::Impl(Impl *this,LogLevel level,int savedErrno,SourceFile *file,int line)

{
  undefined4 *puVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  Timestamp TVar5;
  self *this_00;
  LogStream *pLVar6;
  char **ppcVar7;
  ulong __n;
  char *pcVar8;
  long *in_FS_OFFSET;
  
  TVar5 = Timestamp::now();
  (this->time_).microSecondsSinceEpoch_ = TVar5.microSecondsSinceEpoch_;
  memset(&this->stream_,0,0xfb0);
  (this->stream_).buffer_.cur_ = (this->stream_).buffer_.data_;
  (this->stream_).buffer_.cookie_ = detail::FixedBuffer<4000>::cookieStart;
  this->level_ = level;
  this->line_ = line;
  iVar2 = file->size_;
  uVar3 = *(undefined4 *)&file->field_0xc;
  (this->basename_).data_ = file->data_;
  (this->basename_).size_ = iVar2;
  *(undefined4 *)&(this->basename_).field_0xc = uVar3;
  formatTime(this);
  if ((int)*in_FS_OFFSET == 0) {
    CurrentThread::cacheTid();
  }
  ppcVar7 = &(this->stream_).buffer_.cur_;
  __n = (ulong)(int)*in_FS_OFFSET;
  pcVar8 = *ppcVar7;
  uVar4 = (int)ppcVar7 - (int)pcVar8;
  if (__n < (ulong)(long)(int)uVar4) {
    memcpy(pcVar8,(void *)*in_FS_OFFSET,__n);
    pcVar8 = *ppcVar7 + __n;
    *ppcVar7 = pcVar8;
    uVar4 = (int)ppcVar7 - (int)pcVar8;
  }
  if (6 < uVar4) {
    puVar1 = *(undefined4 **)(LogLevelName + (ulong)level * 8);
    *(undefined2 *)(pcVar8 + 4) = *(undefined2 *)(puVar1 + 1);
    *(undefined4 *)pcVar8 = *puVar1;
    *ppcVar7 = *ppcVar7 + 6;
  }
  if (savedErrno != 0) {
    pcVar8 = strerror_r(savedErrno,(char *)(*in_FS_OFFSET + -0x290),0x200);
    this_00 = LogStream::operator<<(&this->stream_,pcVar8);
    ppcVar7 = &(this_00->buffer_).cur_;
    pcVar8 = (this_00->buffer_).cur_;
    if (8 < (uint)((int)ppcVar7 - (int)pcVar8)) {
      builtin_strncpy(pcVar8," (errno=",8);
      *ppcVar7 = *ppcVar7 + 8;
    }
    pLVar6 = LogStream::operator<<(this_00,savedErrno);
    ppcVar7 = &(pLVar6->buffer_).cur_;
    pcVar8 = (pLVar6->buffer_).cur_;
    if (2 < (uint)((int)ppcVar7 - (int)pcVar8)) {
      pcVar8[0] = ')';
      pcVar8[1] = ' ';
      *ppcVar7 = *ppcVar7 + 2;
    }
  }
  return;
}

Assistant:

Logger::Impl::Impl(LogLevel level, int savedErrno, const SourceFile& file, int line)
  : time_(Timestamp::now()),
    stream_(),
    level_(level),
    line_(line),
    basename_(file)
{
  formatTime();
  CurrentThread::tid();
  stream_ << T(CurrentThread::tidString(), CurrentThread::tidStringLength());
  stream_ << T(LogLevelName[level], 6);
  if (savedErrno != 0)
  {
    stream_ << strerror_tl(savedErrno) << " (errno=" << savedErrno << ") ";
  }
}